

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_recursive_quick_sort.c
# Opt level: O2

int main(void)

{
  int i;
  long lVar1;
  int arr [10];
  
  arr[4] = 0x1f;
  arr[5] = 0xa3;
  arr[6] = 0x48;
  arr[7] = 0x5a;
  arr[0] = 0x23;
  arr[1] = 0x11;
  arr[2] = 0x21;
  arr[3] = 0x59;
  arr[8] = 0x1a;
  arr[9] = 0x15;
  quick_sort(arr,10);
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    printf("%d ",(ulong)(uint)arr[lVar1]);
  }
  return 0;
}

Assistant:

int main() {
  const int n = 10;
  int arr[n] = {35, 17, 33, 89, 31, 163, 72, 90, 26, 21};
  quick_sort(arr, n);
  for (int i = 0; i < n; i++) {
    printf("%d ", arr[i]);
  }

  return 0;
}